

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::BringWindowToDisplayBehind(ImGuiWindow *window,ImGuiWindow *behind_window)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *pIVar2;
  uint uVar3;
  int iVar4;
  ImGuiWindow *unaff_RBX;
  ImGuiWindow **ppIVar5;
  
  pIVar2 = GImGui;
  pIVar1 = window->RootWindow;
  uVar3 = FindWindowDisplayIndex(unaff_RBX);
  iVar4 = FindWindowDisplayIndex(unaff_RBX);
  if ((int)uVar3 < iVar4) {
    ppIVar5 = (pIVar2->Windows).Data;
    memmove(ppIVar5 + (int)uVar3,ppIVar5 + (long)(int)uVar3 + 1,(long)(int)(~uVar3 + iVar4) << 3);
    ppIVar5 = (pIVar2->Windows).Data + (long)iVar4 + -1;
  }
  else {
    ppIVar5 = (pIVar2->Windows).Data;
    memmove(ppIVar5 + (long)iVar4 + 1,ppIVar5 + iVar4,(long)(int)(uVar3 - iVar4) << 3);
    ppIVar5 = (pIVar2->Windows).Data + iVar4;
  }
  *ppIVar5 = pIVar1;
  return;
}

Assistant:

void ImGui::BringWindowToDisplayBehind(ImGuiWindow* window, ImGuiWindow* behind_window)
{
    IM_ASSERT(window != NULL && behind_window != NULL);
    ImGuiContext& g = *GImGui;
    window = window->RootWindow;
    behind_window = behind_window->RootWindow;
    int pos_wnd = FindWindowDisplayIndex(window);
    int pos_beh = FindWindowDisplayIndex(behind_window);
    if (pos_wnd < pos_beh)
    {
        size_t copy_bytes = (pos_beh - pos_wnd - 1) * sizeof(ImGuiWindow*);
        memmove(&g.Windows.Data[pos_wnd], &g.Windows.Data[pos_wnd + 1], copy_bytes);
        g.Windows[pos_beh - 1] = window;
    }
    else
    {
        size_t copy_bytes = (pos_wnd - pos_beh) * sizeof(ImGuiWindow*);
        memmove(&g.Windows.Data[pos_beh + 1], &g.Windows.Data[pos_beh], copy_bytes);
        g.Windows[pos_beh] = window;
    }
}